

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  char *buf;
  int iVar1;
  xmlElementType xVar2;
  xmlOutputBufferPtr out;
  xmlOutputBufferPtr out_00;
  xmlChar *pxVar3;
  bool bVar4;
  xmlDocPtr pxVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  xmlChar *pc;
  xmlDocPtr cur_00;
  byte *pbVar10;
  ulong uVar11;
  _xmlNode *p_Var12;
  xmlBufferPtr buf_00;
  xmlChar *pxVar13;
  int *piVar14;
  _xmlDtd *p_Var15;
  byte *pc_00;
  int iVar16;
  char *pcVar17;
  _xmlDtd *buf_01;
  _xmlDtd *p_Var18;
  _xmlDtd *p_Var19;
  byte bVar20;
  long lVar21;
  _xmlNs *cur_01;
  xmlBufPtr buf_02;
  bool bVar22;
  _xmlDtd *local_78;
  xmlDocPtr local_48;
  _xmlNode **local_38;
  
  iVar1 = ctxt->format;
  out = ctxt->buf;
  buf = ctxt->indent;
  local_48 = (xmlDocPtr)0x0;
  pxVar5 = (xmlDocPtr)cur;
LAB_001adb25:
  cur_00 = pxVar5;
  if (cur_00->type == XML_DOCUMENT_FRAG_NODE) goto code_r0x001adb30;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar14 = __xmlIndentTreeOutput(), *piVar14 != 0)) {
      iVar7 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar7 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar7 * ctxt->indent_size,buf);
    }
    if ((ctxt->options & 0x100) == 0) {
      xmlOutputBufferWrite(out,1,"<");
    }
    else {
      smlWriteSemiColonIfNeeded(out);
    }
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar17 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar17 != (char *)0x0)) {
      xmlOutputBufferWriteString(out,pcVar17);
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,cur_00->name);
    for (cur_01 = cur_00->oldNs; cur_01 != (xmlNsPtr)0x0; cur_01 = cur_01->next) {
      xmlNsDumpOutput(ctxt->buf,cur_01,ctxt);
    }
    for (p_Var18 = cur_00->extSubset; p_Var18 != (_xmlDtd *)0x0; p_Var18 = (_xmlDtd *)p_Var18->next)
    {
      xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var18);
    }
    p_Var12 = cur_00->children;
    if (p_Var12 == (_xmlNode *)0x0) {
      uVar9 = ctxt->options;
      if ((uVar9 & 4) == 0) {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
          uVar9 = ctxt->options;
        }
        if ((uVar9 >> 8 & 1) == 0) {
          iVar7 = 2;
          pcVar17 = "/>";
          goto LAB_001ae2b5;
        }
      }
      else {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,1);
          uVar9 = ctxt->options;
        }
        if ((uVar9 >> 8 & 1) == 0) {
          xmlOutputBufferWrite(out,3,"></");
          if ((*(long *)&cur_00->compression != 0) &&
             (pcVar17 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar17 != (char *)0x0)) {
            xmlOutputBufferWriteString(out,pcVar17);
            xmlOutputBufferWrite(out,1,":");
          }
          xmlOutputBufferWriteString(out,cur_00->name);
          if (ctxt->format == 2) {
            xmlOutputBufferWriteWSNonSig(ctxt,0);
          }
          iVar7 = 1;
          pcVar17 = ">";
          goto LAB_001ae2b5;
        }
        pcVar17 = " {}";
LAB_001ae44d:
        xmlOutputBufferWrite(out,1,pcVar17);
        ctxt->quoted = 0;
      }
      break;
    }
    if (ctxt->format == 2) {
      xmlOutputBufferWriteWSNonSig(ctxt,1);
    }
    else if (ctxt->format == 1) {
      do {
        if (p_Var12->type - XML_TEXT_NODE < 3) {
          ctxt->format = 0;
          local_48 = cur_00;
          break;
        }
        p_Var12 = p_Var12->next;
      } while (p_Var12 != (_xmlNode *)0x0);
    }
    if ((ctxt->options & 0x100) == 0) {
      xmlOutputBufferWrite(out,1,">");
    }
    else {
      xmlOutputBufferWrite(out,1," ");
      ctxt->quoted = 0;
    }
    if (((ctxt->options & 0x100) != 0) &&
       ((cur_00->children->type != XML_TEXT_NODE || (cur_00->children->next != (_xmlNode *)0x0)))) {
      xmlOutputBufferWrite(out,1,"{");
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar5 = (xmlDocPtr)cur_00->children;
    goto LAB_001adb25;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var18 = cur_00->intSubset;
    if ((ctxt->options & 0x100) != 0) {
      if (p_Var18 == (_xmlDtd *)0x0) {
        p_Var18 = (_xmlDtd *)0x1fbfa6;
        cur_00->intSubset = (_xmlDtd *)0x1fbfa6;
      }
      if (((cur_00->prev != (_xmlNode *)0x0) && (*(xmlChar *)&p_Var18->_private != '\n')) &&
         (ctxt->quoted == 0)) {
        smlWriteSemiColonIfNeeded(out);
        p_Var18 = cur_00->intSubset;
      }
      out_00 = ctxt->buf;
      iVar7 = xmlStrlen((xmlChar *)p_Var18);
      p_Var19 = (_xmlDtd *)((long)&p_Var18->_private + (long)iVar7);
      if ((cur_00->prev == (_xmlNode *)0x0) && (cur_00->next == (_xmlNode *)0x0)) {
        bVar22 = false;
LAB_001ae5d0:
        bVar4 = bVar22;
        buf_01 = (_xmlDtd *)0x0;
        iVar16 = 0;
      }
      else {
        lVar21 = 0;
        while ((uVar11 = (ulong)*(byte *)((long)&p_Var18->_private + lVar21), uVar11 < 0x21 &&
               ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))) {
          lVar21 = lVar21 + 1;
        }
        iVar16 = (int)lVar21;
        if (iVar16 != 0) {
          iVar8 = xmlOutputBufferWrite(out_00,iVar16,(char *)p_Var18);
          if ((iVar8 == -1) ||
             (p_Var18 = (_xmlDtd *)((long)&p_Var18->_private + lVar21),
             *(char *)&p_Var18->_private == '\0')) break;
          iVar7 = iVar7 - iVar16;
        }
        p_Var15 = (_xmlDtd *)((long)&p_Var19[-1].pentities + 7);
        buf_01 = p_Var19;
        if (p_Var18 < p_Var15) {
          do {
            if ((0x20 < (ulong)*(byte *)&p_Var15->_private) ||
               ((0x100002600U >> ((ulong)*(byte *)&p_Var15->_private & 0x3f) & 1) == 0)) break;
            p_Var15 = (_xmlDtd *)((long)&p_Var15[-1].pentities + 7);
          } while (p_Var18 < p_Var15);
          buf_01 = (_xmlDtd *)((long)&p_Var15->_private + 1);
        }
        bVar4 = true;
        iVar16 = (int)p_Var19 - (int)buf_01;
        bVar22 = true;
        if (iVar16 == 0) goto LAB_001ae5d0;
        p_Var18 = (_xmlDtd *)xmlStrndup((xmlChar *)p_Var18,iVar7 - iVar16);
        if (p_Var18 == (_xmlDtd *)0x0) break;
        p_Var19 = (_xmlDtd *)((long)&p_Var18->_private + (long)(iVar7 - iVar16));
      }
      if (cur_00->prev != (_xmlNode *)0x0) {
        xVar2 = cur_00->prev->type;
        bVar22 = xVar2 != XML_ENTITY_REF_NODE;
        p_Var12 = cur_00->next;
        if (p_Var12 != (_xmlNode *)0x0) goto LAB_001ae61c;
        if (xVar2 != XML_ENTITY_REF_NODE) goto LAB_001ae626;
        goto LAB_001ae69d;
      }
      p_Var12 = cur_00->next;
      bVar22 = true;
      if (p_Var12 != (_xmlNode *)0x0) {
LAB_001ae61c:
        if ((p_Var12->type == XML_ENTITY_REF_NODE) || (!bVar22)) goto LAB_001ae69d;
      }
LAB_001ae626:
      if (ctxt->quoted == 0) {
        bVar20 = *(byte *)&p_Var18->_private;
        if ((bVar20 == 0 || bVar4) || (p_Var15 = p_Var18, p_Var19 <= p_Var18)) {
LAB_001ae69d:
          if (ctxt->quoted == 0) {
            iVar7 = xmlOutputBufferWrite(out_00,1,"\"");
            if (iVar7 == -1) break;
            ctxt->quoted = 1;
          }
          goto LAB_001ae6d3;
        }
        while( true ) {
          if (((bVar20 < 0x3f) && ((0x7800004d00002600U >> ((ulong)bVar20 & 0x3f) & 1) != 0)) ||
             ((bVar20 == 0x7b || (bVar20 == 0x7d)))) goto LAB_001ae69d;
          p_Var15 = (_xmlDtd *)xmlNextUTF8Char((xmlChar *)p_Var15);
          if (p_Var19 <= p_Var15) break;
          bVar20 = *(byte *)&p_Var15->_private;
        }
        if (bVar20 == 0x5c) goto LAB_001ae69d;
        iVar7 = xmlOutputBufferWriteEscape(out_00,(xmlChar *)p_Var18,smlEscapeRawString);
LAB_001ae722:
        if (iVar7 == -1) break;
      }
      else {
LAB_001ae6d3:
        local_38 = &cur_00->next;
        iVar7 = xmlOutputBufferWriteEscape(out_00,(xmlChar *)p_Var18,smlEscapeQuotedString);
        if (iVar7 == -1) break;
        if ((*local_38 == (_xmlNode *)0x0) || ((*local_38)->type != XML_ENTITY_REF_NODE)) {
          ctxt->quoted = 0;
          iVar7 = xmlOutputBufferWrite(out_00,1,"\"");
          goto LAB_001ae722;
        }
      }
      if ((bVar4 && buf_01 != (_xmlDtd *)0x0) &&
         (iVar7 = xmlOutputBufferWrite(out_00,iVar16,(char *)buf_01), iVar7 != -1)) {
        (*xmlFree)(p_Var18);
      }
      break;
    }
    if (p_Var18 == (_xmlDtd *)0x0) break;
    if ((xmlChar *)cur_00->name != "textnoenc") {
      xmlOutputBufferWriteEscape(out,(xmlChar *)p_Var18,ctxt->escape);
      break;
    }
    goto LAB_001ae1d4;
  case XML_CDATA_SECTION_NODE:
    local_78 = (_xmlDtd *)0x1f9c5f;
    if ((ctxt->options & 0x100) != 0) {
      smlWriteSemiColonIfNeeded(out);
      local_78 = (_xmlDtd *)0x20143b;
    }
    p_Var18 = cur_00->intSubset;
    if ((p_Var18 != (_xmlDtd *)0x0) &&
       (cVar6 = *(char *)&p_Var18->_private, p_Var19 = p_Var18, cVar6 != '\0')) {
      do {
        if (cVar6 == ']') {
          if ((*(char *)((long)&p_Var18->_private + 1) == ']') &&
             (*(char *)((long)&p_Var18->_private + 2) == '>')) {
            p_Var18 = (_xmlDtd *)((long)&p_Var18->_private + 2);
            xmlOutputBufferWriteString(out,(char *)local_78);
            xmlOutputBufferWrite(out,(int)p_Var18 - (int)p_Var19,(char *)p_Var19);
            xmlOutputBufferWriteString(out,"]]>");
            p_Var19 = p_Var18;
          }
        }
        else if (cVar6 == '\0') goto LAB_001ae1aa;
        cVar6 = *(char *)((long)&p_Var18->_private + 1);
        p_Var18 = (_xmlDtd *)((long)&p_Var18->_private + 1);
      } while( true );
    }
    goto LAB_001ae1c5;
  case XML_ENTITY_REF_NODE:
    if (((ctxt->options & 0x100) != 0) && (ctxt->quoted == 0)) {
      xmlOutputBufferWrite(out,1,"\"");
      ctxt->quoted = 1;
    }
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,cur_00->name);
    xmlOutputBufferWrite(out,1,";");
    if ((ctxt->options & 0x100) != 0) {
      p_Var12 = cur_00->next;
      if (p_Var12 == (_xmlNode *)0x0) {
LAB_001ae43e:
        pcVar17 = "\"";
        goto LAB_001ae44d;
      }
      if (p_Var12->type != XML_ENTITY_REF_NODE) {
        if (p_Var12->type != XML_TEXT_NODE) goto LAB_001ae43e;
        for (pbVar10 = p_Var12->content; uVar11 = (ulong)*pbVar10, uVar11 < 0x21;
            pbVar10 = xmlNextUTF8Char(pbVar10)) {
          if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
            if (uVar11 == 0) goto LAB_001ae43e;
            break;
          }
        }
      }
    }
    break;
  case XML_PI_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar14 = __xmlIndentTreeOutput(), *piVar14 != 0)) {
      iVar7 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar7 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar7 * ctxt->indent_size,buf);
    }
    p_Var18 = cur_00->intSubset;
    xmlOutputBufferWrite(out,2,"<?");
    xmlOutputBufferWriteString(out,cur_00->name);
    if (p_Var18 == (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
    }
    else if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      else {
        xmlOutputBufferWrite(out,1," ");
      }
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
    }
    iVar7 = 2;
    pcVar17 = "?>";
LAB_001ae2b5:
    xmlOutputBufferWrite(out,iVar7,pcVar17);
    break;
  case XML_COMMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar14 = __xmlIndentTreeOutput(), *piVar14 != 0)) {
      iVar7 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar7 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar7 * ctxt->indent_size,buf);
    }
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if ((ctxt->options & 0x100) == 0) {
        xmlOutputBufferWrite(out,4,"<!--");
        xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
        iVar7 = 3;
        pcVar17 = "-->";
      }
      else {
        smlWriteSemiColonIfNeeded(out);
        pxVar13 = xmlStrchr((xmlChar *)cur_00->intSubset,'\n');
        if (pxVar13 == (xmlChar *)0x0) {
          if ((ctxt->format != 0) || ((_xmlDoc *)cur_00->parent == cur_00->doc)) {
LAB_001ae35d:
            xmlOutputBufferWrite(out,1,"#");
            p_Var18 = cur_00->intSubset;
            goto LAB_001ae1d4;
          }
          p_Var12 = cur_00->next;
          if ((p_Var12 != (_xmlNode *)0x0) && (p_Var12->type == XML_TEXT_NODE)) {
            pbVar10 = p_Var12->content;
            for (pc_00 = pbVar10; uVar11 = (ulong)*pc_00, uVar11 < 0x21;
                pc_00 = xmlNextUTF8Char(pc_00)) {
              if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
                if ((uVar11 == 0) && (*pbVar10 == 10)) goto LAB_001ae35d;
                break;
              }
            }
          }
        }
        xmlOutputBufferWrite(out,3,"#--");
        xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
        iVar7 = 2;
        pcVar17 = "--";
      }
      goto LAB_001ae2b5;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,cur_00);
    break;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    buf_02 = out->buffer;
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpElementDecl(buf_02,(xmlElementPtr)cur_00);
    }
    else {
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpElementDecl(buf_00,(xmlElementPtr)cur_00);
LAB_001ae0c2:
        pxVar3 = buf_00->content;
        uVar9 = buf_00->use;
        pxVar13 = pxVar3 + (long)(int)uVar9 + -2;
        pxVar13[0] = '\n';
        pxVar13[1] = '0';
        xmlBufAdd(buf_02,pxVar3 + 1,uVar9 - 2);
        xmlBufferFree(buf_00);
      }
    }
    break;
  case XML_ATTRIBUTE_DECL:
    buf_02 = out->buffer;
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpAttributeDecl(buf_02,(xmlAttributePtr)cur_00);
    }
    else {
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpAttributeDecl(buf_00,(xmlAttributePtr)cur_00);
        goto LAB_001ae0c2;
      }
    }
    break;
  case XML_ENTITY_DECL:
    buf_02 = out->buffer;
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpEntityDecl(buf_02,(xmlEntityPtr)cur_00);
    }
    else {
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpEntityDecl(buf_00,(xmlEntityPtr)cur_00);
        goto LAB_001ae0c2;
      }
    }
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(ctxt->buf,(xmlNsPtr)cur_00,ctxt);
  }
switchD_001adb57_caseD_6:
  while( true ) {
    if (cur_00 == (xmlDocPtr)cur) {
      return;
    }
    if ((ctxt->format == 1) && (1 < cur_00->type - XML_XINCLUDE_START)) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    pxVar5 = (xmlDocPtr)cur_00->next;
    if ((xmlDocPtr)cur_00->next != (xmlDocPtr)0x0) break;
    cur_00 = (xmlDocPtr)cur_00->parent;
    if (cur_00 == (xmlDocPtr)0x0) {
      return;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar14 = __xmlIndentTreeOutput();
      if ((*piVar14 != 0) && (ctxt->format == 1)) {
        iVar7 = ctxt->indent_nr;
        if (ctxt->level < ctxt->indent_nr) {
          iVar7 = ctxt->level;
        }
        xmlOutputBufferWrite(out,iVar7 * ctxt->indent_size,buf);
      }
      uVar9 = ctxt->options;
      if (((uVar9 >> 8 & 1) != 0) &&
         ((cur_00->children->type != XML_TEXT_NODE || (cur_00->children->next != (_xmlNode *)0x0))))
      {
        xmlOutputBufferWrite(out,1,"}");
        uVar9 = ctxt->options;
      }
      if ((uVar9 >> 8 & 1) == 0) {
        xmlOutputBufferWrite(out,2,"</");
        if ((*(long *)&cur_00->compression != 0) &&
           (pcVar17 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar17 != (char *)0x0)) {
          xmlOutputBufferWriteString(out,pcVar17);
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,cur_00->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(out,1,">");
      }
      if (cur_00 == local_48) {
        ctxt->format = iVar1;
        local_48 = (xmlDocPtr)0x0;
      }
    }
  }
  goto LAB_001adb25;
code_r0x001adb30:
  pxVar5 = (xmlDocPtr)cur_00->children;
  if ((xmlDocPtr)cur_00->children != (xmlDocPtr)0x0) goto LAB_001adb25;
  goto switchD_001adb57_caseD_6;
LAB_001ae1aa:
  if (p_Var19 != p_Var18) {
    xmlOutputBufferWriteString(out,(char *)local_78);
    local_78 = p_Var19;
LAB_001ae1c5:
    xmlOutputBufferWriteString(out,(char *)local_78);
    p_Var18 = (_xmlDtd *)0x2013f2;
LAB_001ae1d4:
    xmlOutputBufferWriteString(out,(char *)p_Var18);
  }
  goto switchD_001adb57_caseD_6;
}

Assistant:

static void
xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlAttrPtr attr;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf;
    DEBUG_CODE(
    const char *pszValue;
    char *c0;
    char *c1;
    switch (cur->type) {
    case XML_TEXT_NODE:
    	pszValue = dbgStr(cur->content);
    	c0 = c1 = "";
    	break;
    case XML_ENTITY_REF_NODE:
    	pszValue = cur->name;
    	c0 = "&";
    	c1 = ";";
    	break;
    default:
    	pszValue = cur->name;
    	c0 = "<";
    	c1 = ">";
    	break;
    }
    );

    DEBUG_ENTER(("xmlNodeDumpOutputInternal(%p, %p [%s]%s%s%s);\n", ctxt, cur, pszXmlElementType[cur->type], c0, pszValue, c1));

    if (cur == NULL) RETURN();
    buf = ctxt->buf;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
            break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
	    break;

        case XML_ELEMENT_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    } else {					/* SML */
	        smlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    }
            break;

        case XML_ATTRIBUTE_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    } else {					/* SML */
	        smlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    }
            break;

        case XML_ENTITY_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    } else {					/* SML */
	        smlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    }
            break;

        case XML_ELEMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

	    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		xmlOutputBufferWrite(buf, 1, "<");
	    } else {						/* SML */
		smlWriteSemiColonIfNeeded(buf);
	    }
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            for (attr = cur->properties; attr != NULL; attr = attr->next)
                xmlAttrDumpOutput(ctxt, attr);

            if (cur->children == NULL) {
                if ((ctxt->options & XML_SAVE_NO_EMPTY) == 0) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    if (!(ctxt->options & XML_SAVE_AS_SML))	{	/* XML */
			xmlOutputBufferWrite(buf, 2, "/>");
		    } /* Else nothing to do as empty tags are implicit for SML */
                } else {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 1);
		    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
			xmlOutputBufferWrite(buf, 3, "></");
			if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			    xmlOutputBufferWriteString(buf,
				    (const char *)cur->ns->prefix);
			    xmlOutputBufferWrite(buf, 1, ":");
			}
			xmlOutputBufferWriteString(buf, (const char *)cur->name);
			if (ctxt->format == 2)
			    xmlOutputBufferWriteWSNonSig(ctxt, 0);
			xmlOutputBufferWrite(buf, 1, ">");
		    } else {						/* SML */
			xmlOutputBufferWrite(buf, 1, " {}");
			ctxt->quoted = 0;
		    }
                }
            } else {
                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_CDATA_SECTION_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            ctxt->format = 0;
                            unformattedNode = cur;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 1);
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 1, ">");
		} else {						/* SML */
		    xmlOutputBufferWrite(buf, 1, " ");
		    ctxt->quoted = 0;
		}
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "{");
		}
                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		if (cur->content == NULL)
		    break;
		if (cur->name != xmlStringTextNoenc) {
		    xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
		} else {
		    /*
		     * Disable escaping, needed for XSLT
		     */
		    xmlOutputBufferWriteString(buf, (const char *) cur->content);
		}
	    } else {					/* SML */
		if (cur->content == NULL) cur->content = (xmlChar *)"";
		if (cur->prev && (cur->content[0] != '\n') && !ctxt->quoted) {
		    smlWriteSemiColonIfNeeded(buf);
		}
		smlTextNodeDumpOutput(ctxt, cur);
	    }
	    break;

        case XML_PI_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    else
                        xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 4, "<!--");
		    xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    xmlOutputBufferWrite(buf, 3, "-->");
		} else {						/* SML */
		    smlWriteSemiColonIfNeeded(buf);
		    /* If the comment does not fit on a single line */
		    DEBUG_PRINTF(("\\x%02X ... \\x%02X\n", cur->content[0], cur->content[xmlStrlen(cur->content)-1]));
		    if (   xmlStrchr(cur->content, '\n')
			/* Or we're not in formatted mode, and can predict that something will follow on the same line */
			|| (   (!ctxt->format)
			       /* Exception for comments at the top level: xmlDocContentDumpOutput() appends an \n after each top node */
			    && (cur->parent != (struct _xmlNode *)cur->doc)
			    && (/* No other sibling node follows, so that there will be a } on the same line */
				   (!cur->next)
				/* Or if it's followed by anything except blank text beginning with a new line */
				|| (cur->next->type != XML_TEXT_NODE)	/* Not text, so there will be a ; then that next node */
				|| (!xmlStrIsAllBlank(cur->next->content)	/* Non blank text, so the first line will be visible or quoted */
				|| (cur->next->content[0] != '\n'))))	/* Blank text, not quoted, but we must preserve the spaces ahead */
			) {		/* Use the long form */
			xmlOutputBufferWrite(buf, 3, "#--");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
			xmlOutputBufferWrite(buf, 2, "--");
		    } else {	/* Use the short 1-line form */
			xmlOutputBufferWrite(buf, 1, "#");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    }
		}
            }
            break;

        case XML_ENTITY_REF_NODE:
	    DEBUG_PRINTF(("# Dumping entity &%s;\n", cur->name));
	    if ((ctxt->options & XML_SAVE_AS_SML) && !ctxt->quoted) { /* SML */
		xmlOutputBufferWrite(buf, 1, "\"");
		ctxt->quoted = 1;
	    }
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
	    if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
		if (!cur->next ||
		    (   (cur->next->type != XML_ENTITY_REF_NODE)
		     && (   (cur->next->type != XML_TEXT_NODE)
			 || xmlStrIsAllBlank(cur->next->content)))) {
		    xmlOutputBufferWrite(buf, 1, "\"");
		    ctxt->quoted = 0;
		}
	    }
            break;

        case XML_CDATA_SECTION_NODE: {
	    const char *pszBeginCData;
	    const char *pszEndCData = "]]>";
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		pszBeginCData = "<![CDATA[";
	    } else {					/* SML */
		pszBeginCData = "<[[";
		smlWriteSemiColonIfNeeded(buf);
	    }
	    if (cur->content == NULL || *cur->content == '\0') {
		xmlOutputBufferWriteString(buf, pszBeginCData);
		xmlOutputBufferWriteString(buf, pszEndCData);
	    } else {
		start = end = cur->content;
		while (*end != '\0') {
		    if ((*end == ']') && (*(end + 1) == ']') &&
			(*(end + 2) == '>')) {
			end = end + 2;
			xmlOutputBufferWriteString(buf, pszBeginCData);
			xmlOutputBufferWrite(buf, end - start, (const char *)start);
			xmlOutputBufferWriteString(buf, pszEndCData);
			start = end;
		    }
		    end++;
		}
		if (start != end) {
		    xmlOutputBufferWriteString(buf, pszBeginCData);
		    xmlOutputBufferWriteString(buf, (const char *)start);
		    xmlOutputBufferWriteString(buf, pszEndCData);
		}
	    }
            break;
        }
        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
            break;

        case XML_NAMESPACE_DECL:
            xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                RETURN();
            if ((ctxt->format == 1) &&
                (cur->type != XML_XINCLUDE_START) &&
                (cur->type != XML_XINCLUDE_END))
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                RETURN();
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "}");
		}

		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 2, "</");
		    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
			xmlOutputBufferWrite(buf, 1, ":");
		    }
	    
		    xmlOutputBufferWriteString(buf, (const char *)cur->name);
		    if (ctxt->format == 2)
			xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    xmlOutputBufferWrite(buf, 1, ">");
		}

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
    RETURN();
}